

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qminimalintegration.cpp
# Opt level: O0

QPlatformFontDatabase * __thiscall QMinimalIntegration::fontDatabase(QMinimalIntegration *this)

{
  void *pvVar1;
  DummyFontDatabase *this_00;
  long in_RDI;
  QFontconfigDatabase *in_stack_ffffffffffffffe0;
  
  if (((*(long *)(in_RDI + 8) == 0) && ((*(uint *)(in_RDI + 0x20) & 2) != 0)) &&
     (*(long *)(in_RDI + 8) == 0)) {
    pvVar1 = operator_new(8);
    QFontconfigDatabase::QFontconfigDatabase(in_stack_ffffffffffffffe0);
    *(void **)(in_RDI + 8) = pvVar1;
  }
  if (*(long *)(in_RDI + 8) == 0) {
    this_00 = (DummyFontDatabase *)operator_new(8);
    DummyFontDatabase::DummyFontDatabase(this_00);
    *(DummyFontDatabase **)(in_RDI + 8) = this_00;
  }
  return *(QPlatformFontDatabase **)(in_RDI + 8);
}

Assistant:

QPlatformFontDatabase *QMinimalIntegration::fontDatabase() const
{
    if (!m_fontDatabase && (m_options & EnableFonts)) {
#if defined(Q_OS_WIN)
        if (m_options & FreeTypeFontDatabase) {
#  if QT_CONFIG(freetype)
            m_fontDatabase = new QWindowsFontDatabaseFT;
#  endif // freetype
        } else {
            m_fontDatabase = new QWindowsFontDatabase;
        }
#elif defined(Q_OS_DARWIN)
        if (!(m_options & FontconfigDatabase)) {
            if (m_options & FreeTypeFontDatabase) {
#  if QT_CONFIG(freetype)
                m_fontDatabase = new QCoreTextFontDatabaseEngineFactory<QFontEngineFT>;
#  endif // freetype
            } else {
                m_fontDatabase = new QCoreTextFontDatabaseEngineFactory<QCoreTextFontEngine>;
            }
        }
#endif

        if (!m_fontDatabase) {
#if QT_CONFIG(fontconfig)
            m_fontDatabase = new QGenericUnixFontDatabase;
#else
            m_fontDatabase = QPlatformIntegration::fontDatabase();
#endif
        }
    }
    if (!m_fontDatabase)
        m_fontDatabase = new DummyFontDatabase;
    return m_fontDatabase;
}